

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall Parser::parse(Parser *this,char *infile)

{
  tok *ptVar1;
  DatalogProgram *pDVar2;
  _Rb_tree_header *p_Var3;
  exception e;
  
  Scanner::scan(this->s,infile);
  std::vector<tok,_std::allocator<tok>_>::operator=(&this->toks,&this->s->toks);
  ptVar1 = (this->toks).super__Vector_base<tok,_std::allocator<tok>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->it)._M_current = ptVar1;
  tok::operator=(&this->curr,ptVar1);
  pDVar2 = (DatalogProgram *)operator_new(0x90);
  p_Var3 = &(pDVar2->domain)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(pDVar2->domain)._M_t._M_impl = 0;
  *(undefined8 *)&(pDVar2->domain)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (pDVar2->queries).super__Vector_base<Predicate_*,_std::allocator<Predicate_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pDVar2->queries).super__Vector_base<Predicate_*,_std::allocator<Predicate_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pDVar2->facts).super__Vector_base<Predicate_*,_std::allocator<Predicate_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pDVar2->queries).super__Vector_base<Predicate_*,_std::allocator<Predicate_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pDVar2->facts).super__Vector_base<Predicate_*,_std::allocator<Predicate_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pDVar2->facts).super__Vector_base<Predicate_*,_std::allocator<Predicate_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pDVar2->rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pDVar2->rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pDVar2->domain)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pDVar2->schemes).super__Vector_base<Predicate_*,_std::allocator<Predicate_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pDVar2->rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pDVar2->schemes).super__Vector_base<Predicate_*,_std::allocator<Predicate_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pDVar2->schemes).super__Vector_base<Predicate_*,_std::allocator<Predicate_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pDVar2->domain)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (pDVar2->domain)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  (pDVar2->domain)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->prog = pDVar2;
  datalogProgram(this);
  match(this,END_FILE);
  return;
}

Assistant:

void Parser::parse(char * infile){
	try {
		s->scan(infile);
		toks = s->toks;

		it = toks.begin();
		curr = *it;
		prog = new DatalogProgram();
		// Predicate* p = new Predicate("BAR");
		// p->params.push_back(new Parameter((string)"FOO"));
		// prog->addScheme(p);
		datalogProgram();
//		cout << prog->toString() << endl;
		match(END_FILE);
//		cout << prog->toString() << endl;
	}
	catch (exception e) {
		throw;
	}
}